

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O0

void t3strlwr(char *p)

{
  wchar_t wVar1;
  char *in_RDI;
  char *local_8;
  
  for (local_8 = in_RDI; *local_8 != '\0'; local_8 = local_8 + 1) {
    wVar1 = to_lower(L'\0');
    *local_8 = (char)wVar1;
  }
  return;
}

Assistant:

void t3strlwr(char *p)
{
    for ( ; *p != '\0' ; ++p)
        *p = (char)to_lower(*p);
}